

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::tryAddCardsOnTableauPileAndClearHand
          (EventsProcessorLeftMouseButtonUpEventTests *this,PileId *id)

{
  TypedExpectation<void_(solitaire::piles::PileId)> *this_00;
  PileId local_7c;
  anon_class_8_1_ff5615ad_for_function_impl local_78;
  Action<void_(solitaire::piles::PileId)> local_70;
  MatcherBase<solitaire::piles::PileId> local_50;
  MockSpec<void_(solitaire::piles::PileId)> local_38;
  
  local_7c = (PileId)id->t;
  testing::Matcher<solitaire::piles::PileId>::Matcher
            ((Matcher<solitaire::piles::PileId> *)&local_50,&local_7c);
  SolitaireMock::gmock_tryAddCardsOnTableauPile
            (&local_38,&(this->super_EventsProcessorTests).solitaireMock.super_SolitaireMock,
             (Matcher<solitaire::piles::PileId> *)&local_50);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(solitaire::piles::PileId)>::InternalExpectedAt
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x17e,"solitaireMock","tryAddCardsOnTableauPile(id)");
  local_78.cardsToClear = &this->cardsInHand;
  testing::Action<void(solitaire::piles::PileId)>::
  Action<solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::tryAddCardsOnTableauPileAndClearHand(solitaire::piles::PileId)::_lambda()_1_,void>
            (&local_70,&local_78);
  testing::internal::TypedExpectation<void_(solitaire::piles::PileId)>::WillOnce(this_00,&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_38.matchers_);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase(&local_50);
  return;
}

Assistant:

void tryAddCardsOnTableauPileAndClearHand(const PileId id) {
        auto& cardsToClear = cardsInHand;
        EXPECT_CALL(solitaireMock, tryAddCardsOnTableauPile(id))
            .WillOnce(Invoke([&cardsToClear]() { cardsToClear.clear(); }));
    }